

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O3

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::operator==
          (Dynamic_Object_Function *this,Proxy_Function_Base *f)

{
  size_t __n;
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = __dynamic_cast(f,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  if ((lVar3 == 0) || (__n = *(size_t *)(lVar3 + 0x30), __n != (this->m_type_name)._M_string_length)
     ) {
    return false;
  }
  if ((__n != 0) &&
     (iVar2 = bcmp(*(void **)(lVar3 + 0x28),(this->m_type_name)._M_dataplus._M_p,__n), iVar2 != 0))
  {
    return false;
  }
  uVar1 = (**(code **)(**(long **)(lVar3 + 0x48) + 0x10))
                    (*(long **)(lVar3 + 0x48),
                     (this->m_func).
                     super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  return (bool)uVar1;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &f) const CHAISCRIPT_OVERRIDE
          {
            if (const auto *df = dynamic_cast<const Dynamic_Object_Function *>(&f))
            {
              return df->m_type_name == m_type_name && (*df->m_func) == (*m_func);
            } else {
              return false;
            }
          }